

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TripWire.hpp
# Opt level: O0

vector<std::shared_ptr<std::atomic<bool>_>,_std::allocator<std::shared_ptr<std::atomic<bool>_>_>_> *
gmlc::concurrency::make_triplines
          (vector<std::shared_ptr<std::atomic<bool>_>,_std::allocator<std::shared_ptr<std::atomic<bool>_>_>_>
           *__return_storage_ptr__,int count)

{
  bool bVar1;
  shared_ptr<std::atomic<bool>_> local_58;
  shared_ptr<std::atomic<bool>_> *local_48;
  shared_ptr<std::atomic<bool>_> *line;
  iterator __end2;
  iterator __begin2;
  vector<std::shared_ptr<std::atomic<bool>_>,_std::allocator<std::shared_ptr<std::atomic<bool>_>_>_>
  *__range2;
  allocator<std::shared_ptr<std::atomic<bool>_>_> local_16;
  undefined1 local_15;
  int local_14;
  vector<std::shared_ptr<std::atomic<bool>_>,_std::allocator<std::shared_ptr<std::atomic<bool>_>_>_>
  *pvStack_10;
  int count_local;
  vector<std::shared_ptr<std::atomic<bool>_>,_std::allocator<std::shared_ptr<std::atomic<bool>_>_>_>
  *lines;
  
  local_15 = 0;
  local_14 = count;
  pvStack_10 = __return_storage_ptr__;
  std::allocator<std::shared_ptr<std::atomic<bool>_>_>::allocator(&local_16);
  std::
  vector<std::shared_ptr<std::atomic<bool>_>,_std::allocator<std::shared_ptr<std::atomic<bool>_>_>_>
  ::vector(__return_storage_ptr__,(long)count,&local_16);
  std::allocator<std::shared_ptr<std::atomic<bool>_>_>::~allocator(&local_16);
  __end2 = std::
           vector<std::shared_ptr<std::atomic<bool>_>,_std::allocator<std::shared_ptr<std::atomic<bool>_>_>_>
           ::begin(__return_storage_ptr__);
  line = (shared_ptr<std::atomic<bool>_> *)
         std::
         vector<std::shared_ptr<std::atomic<bool>_>,_std::allocator<std::shared_ptr<std::atomic<bool>_>_>_>
         ::end(__return_storage_ptr__);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<std::shared_ptr<std::atomic<bool>_>_*,_std::vector<std::shared_ptr<std::atomic<bool>_>,_std::allocator<std::shared_ptr<std::atomic<bool>_>_>_>_>
                                     *)&line), bVar1) {
    local_48 = __gnu_cxx::
               __normal_iterator<std::shared_ptr<std::atomic<bool>_>_*,_std::vector<std::shared_ptr<std::atomic<bool>_>,_std::allocator<std::shared_ptr<std::atomic<bool>_>_>_>_>
               ::operator*(&__end2);
    std::make_shared<std::atomic<bool>,bool>((bool *)&local_58);
    std::shared_ptr<std::atomic<bool>_>::operator=(local_48,&local_58);
    std::shared_ptr<std::atomic<bool>_>::~shared_ptr(&local_58);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<std::atomic<bool>_>_*,_std::vector<std::shared_ptr<std::atomic<bool>_>,_std::allocator<std::shared_ptr<std::atomic<bool>_>_>_>_>
    ::operator++(&__end2);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<TriplineType> make_triplines(int count)
{
    std::vector<TriplineType> lines(count);
    for (auto& line : lines) {
        line = std::make_shared<std::atomic<bool>>(false);
    }
    return lines;
}